

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaQNameRefPtr
xmlSchemaNewQNameRef
          (xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypeType refType,xmlChar *refName,xmlChar *refNs)

{
  int iVar1;
  xmlSchemaParserCtxtPtr local_38;
  xmlSchemaQNameRefPtr ret;
  xmlChar *refNs_local;
  xmlChar *refName_local;
  xmlSchemaTypeType refType_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  local_38 = (xmlSchemaParserCtxtPtr)(*xmlMalloc)(0x30);
  if (local_38 == (xmlSchemaParserCtxtPtr)0x0) {
    xmlSchemaPErrMemory(pctxt);
    pctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    local_38->serror = (xmlStructuredErrorFunc)0x0;
    local_38->type = 2000;
    local_38->warning = (xmlSchemaValidityWarningFunc)refName;
    *(xmlChar **)&local_38->err = refNs;
    local_38->errCtxt = (void *)0x0;
    *(xmlSchemaTypeType *)&local_38->error = refType;
    if (local_38 != (xmlSchemaParserCtxtPtr)0x0) {
      iVar1 = xmlSchemaAddItemSize(&pctxt->constructor->bucket->locals,10,local_38);
      if (iVar1 < 0) {
        xmlSchemaPErrMemory(pctxt);
        (*xmlFree)(local_38);
        local_38 = (xmlSchemaParserCtxtPtr)0x0;
      }
    }
    pctxt_local = local_38;
  }
  return (xmlSchemaQNameRefPtr)pctxt_local;
}

Assistant:

static xmlSchemaQNameRefPtr
xmlSchemaNewQNameRef(xmlSchemaParserCtxtPtr pctxt,
		     xmlSchemaTypeType refType,
		     const xmlChar *refName,
		     const xmlChar *refNs)
{
    xmlSchemaQNameRefPtr ret;

    ret = (xmlSchemaQNameRefPtr)
	xmlMalloc(sizeof(xmlSchemaQNameRef));
    if (ret == NULL) {
	xmlSchemaPErrMemory(pctxt);
	return (NULL);
    }
    ret->node = NULL;
    ret->type = XML_SCHEMA_EXTRA_QNAMEREF;
    ret->name = refName;
    ret->targetNamespace = refNs;
    ret->item = NULL;
    ret->itemType = refType;
    /*
    * Store the reference item in the schema.
    */
    WXS_ADD_LOCAL(pctxt, ret);
    return (ret);
}